

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986PathAbsolute(xmlURIPtr uri,char **str)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  char *cur;
  xmlChar *local_28;
  
  iVar1 = 1;
  if (**str == '/') {
    local_28 = (xmlChar *)(*str + 1);
    iVar1 = xmlParse3986Segment((char **)&local_28,'\0',0);
    if (iVar1 == 0) {
      iVar1 = 1;
      do {
        if (*local_28 != '/') goto LAB_0018df44;
        local_28 = local_28 + 1;
        iVar2 = xmlParse3986Segment((char **)&local_28,'\0',1);
      } while (iVar2 == 0);
    }
    else {
LAB_0018df44:
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
        }
        pxVar3 = (xmlChar *)*str;
        if (local_28 == pxVar3) {
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          iVar1 = (int)local_28 - (int)pxVar3;
          if ((uri->cleanup & 2) == 0) {
            pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)pxVar3,iVar1,(char *)0x0);
          }
          else {
            pxVar3 = xmlStrndup(pxVar3,iVar1);
          }
        }
        uri->path = (char *)pxVar3;
      }
      *str = (char *)local_28;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlParse3986PathAbsolute(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    if (*cur != '/')
        return(1);
    cur++;
    ret = xmlParse3986Segment(&cur, 0, 0);
    if (ret == 0) {
	while (*cur == '/') {
	    cur++;
	    ret = xmlParse3986Segment(&cur, 0, 1);
	    if (ret != 0) return(ret);
	}
    }
    if (uri != NULL) {
	if (uri->path != NULL) xmlFree(uri->path);
        if (cur != *str) {
            if (uri->cleanup & 2)
                uri->path = STRNDUP(*str, cur - *str);
            else
                uri->path = xmlURIUnescapeString(*str, cur - *str, NULL);
        } else {
            uri->path = NULL;
        }
    }
    *str = cur;
    return (0);
}